

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_split_form_urlencoded(char *data,mg_header *form_fields,uint num_form_fields)

{
  char *pcVar1;
  bool bVar2;
  int local_38;
  int local_34;
  int num;
  int i;
  char *b;
  uint num_form_fields_local;
  mg_header *form_fields_local;
  char *data_local;
  
  local_38 = 0;
  if (data == (char *)0x0) {
    data_local._4_4_ = -1;
  }
  else {
    form_fields_local = (mg_header *)data;
    if ((form_fields == (mg_header *)0x0) && (num_form_fields == 0)) {
      if (*data == '\0') {
        data_local._4_4_ = 0;
      }
      else {
        local_38 = 1;
        for (; *(char *)&form_fields_local->name != '\0';
            form_fields_local = (mg_header *)((long)&form_fields_local->name + 1)) {
          if (*(char *)&form_fields_local->name == '&') {
            local_38 = local_38 + 1;
          }
        }
        data_local._4_4_ = local_38;
      }
    }
    else if ((form_fields == (mg_header *)0x0) || ((int)num_form_fields < 1)) {
      data_local._4_4_ = -1;
    }
    else {
      for (local_34 = 0; local_34 < (int)num_form_fields; local_34 = local_34 + 1) {
        while( true ) {
          bVar2 = true;
          if (*(char *)&form_fields_local->name != ' ') {
            bVar2 = *(char *)&form_fields_local->name == '\t';
          }
          if (!bVar2) break;
          form_fields_local = (mg_header *)((long)&form_fields_local->name + 1);
        }
        if (*(char *)&form_fields_local->name == '\0') break;
        form_fields[local_38].name = (char *)form_fields_local;
        _num = form_fields_local;
        while( true ) {
          bVar2 = false;
          if ((*(char *)&_num->name != '\0') && (bVar2 = false, *(char *)&_num->name != '&')) {
            bVar2 = *(char *)&_num->name != '=';
          }
          if (!bVar2) break;
          _num = (mg_header *)((long)&_num->name + 1);
        }
        if (*(char *)&_num->name == '\0') {
          form_fields[local_38].value = (char *)0x0;
        }
        else if (*(char *)&_num->name == '&') {
          form_fields[local_38].value = (char *)0x0;
        }
        else {
          *(undefined1 *)&_num->name = 0;
          form_fields_local = (mg_header *)((long)&_num->name + 1);
          form_fields[local_38].value = (char *)form_fields_local;
        }
        local_38 = local_38 + 1;
        pcVar1 = strchr((char *)form_fields_local,0x26);
        if (pcVar1 == (char *)0x0) break;
        *pcVar1 = '\0';
        form_fields_local = (mg_header *)(pcVar1 + 1);
      }
      for (local_34 = 0; local_34 < local_38; local_34 = local_34 + 1) {
        if (form_fields[local_34].name != (char *)0x0) {
          url_decode_in_place(form_fields[local_34].name);
        }
        if (form_fields[local_34].value != (char *)0x0) {
          url_decode_in_place(form_fields[local_34].value);
        }
      }
      data_local._4_4_ = local_38;
    }
  }
  return data_local._4_4_;
}

Assistant:

CIVETWEB_API int
mg_split_form_urlencoded(char *data,
                         struct mg_header *form_fields,
                         unsigned num_form_fields)
{
	char *b;
	int i;
	int num = 0;

	if (data == NULL) {
		/* parameter error */
		return -1;
	}

	if ((form_fields == NULL) && (num_form_fields == 0)) {
		/* determine the number of expected fields */
		if (data[0] == 0) {
			return 0;
		}
		/* count number of & to return the number of key-value-pairs */
		num = 1;
		while (*data) {
			if (*data == '&') {
				num++;
			}
			data++;
		}
		return num;
	}

	if ((form_fields == NULL) || ((int)num_form_fields <= 0)) {
		/* parameter error */
		return -1;
	}

	for (i = 0; i < (int)num_form_fields; i++) {
		/* extract key-value pairs from input data */
		while ((*data == ' ') || (*data == '\t')) {
			/* skip initial spaces */
			data++;
		}
		if (*data == 0) {
			/* end of string reached */
			break;
		}
		form_fields[num].name = data;

		/* find & or = */
		b = data;
		while ((*b != 0) && (*b != '&') && (*b != '=')) {
			b++;
		}

		if (*b == 0) {
			/* last key without value */
			form_fields[num].value = NULL;
		} else if (*b == '&') {
			/* mid key without value */
			form_fields[num].value = NULL;
		} else {
			/* terminate string */
			*b = 0;
			/* value starts after '=' */
			data = b + 1;
			form_fields[num].value = data;
		}

		/* new field is stored */
		num++;

		/* find a next key */
		b = strchr(data, '&');
		if (b == 0) {
			/* no more data */
			break;
		} else {
			/* terminate value of last field at '&' */
			*b = 0;
			/* next key-value-pairs starts after '&' */
			data = b + 1;
		}
	}

	/* Decode all values */
	for (i = 0; i < num; i++) {
		if (form_fields[i].name) {
			url_decode_in_place((char *)form_fields[i].name);
		}
		if (form_fields[i].value) {
			url_decode_in_place((char *)form_fields[i].value);
		}
	}

	/* return number of fields found */
	return num;
}